

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallFinalizableHeapBlock.cpp
# Opt level: O0

bool __thiscall
Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>::RescanTrackedObject
          (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *this,
          FinalizableObject *object,uint objectIndex,Recycler *recycler)

{
  code *pcVar1;
  bool bVar2;
  ConfigFlagsTable *pCVar3;
  undefined4 *puVar4;
  byte *pbVar5;
  Recycler *recycler_local;
  uint objectIndex_local;
  FinalizableObject *object_local;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *this_local;
  
  pCVar3 = Recycler::GetRecyclerFlagsTable(recycler);
  if ((pCVar3->Verbose & 1U) != 0) {
    pCVar3 = Recycler::GetRecyclerFlagsTable(recycler);
    bVar2 = Js::Phases::IsEnabled(&pCVar3->Trace,RecyclerPhase);
    if (bVar2) {
      Output::Print(L"Marking 0x%08x during rescan\n",object);
    }
  }
  if ((recycler->inPartialCollectMode & 1U) == 0) {
    bVar2 = Recycler::DoQueueTrackedObject(recycler);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBlock.cpp"
                         ,0x1a5,"(recycler->DoQueueTrackedObject())",
                         "recycler->DoQueueTrackedObject()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    bVar2 = Recycler::QueueTrackedObject(recycler,object);
    if (!bVar2) {
      return false;
    }
  }
  else {
    bVar2 = Recycler::DoQueueTrackedObject(recycler);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBlock.cpp"
                         ,0x1a0,"(!recycler->DoQueueTrackedObject())",
                         "!recycler->DoQueueTrackedObject()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
  }
  (recycler->collectionStats).trackCount = (recycler->collectionStats).trackCount + 1;
  pbVar5 = SmallHeapBlockT<MediumAllocationBlockAttributes>::ObjectInfo
                     ((SmallHeapBlockT<MediumAllocationBlockAttributes> *)this,objectIndex);
  if ((*pbVar5 & 0x80) != 0) {
    (recycler->collectionStats).finalizeCount = (recycler->collectionStats).finalizeCount + 1;
  }
  pbVar5 = SmallHeapBlockT<MediumAllocationBlockAttributes>::ObjectInfo
                     ((SmallHeapBlockT<MediumAllocationBlockAttributes> *)this,objectIndex);
  *pbVar5 = *pbVar5 & 0xfb;
  return true;
}

Assistant:

bool
SmallFinalizableHeapBlockT<TBlockAttributes>::RescanTrackedObject(FinalizableObject * object, uint objectIndex, Recycler * recycler)
{
    RecyclerVerboseTrace(recycler->GetRecyclerFlagsTable(), _u("Marking 0x%08x during rescan\n"), object);
#if ENABLE_CONCURRENT_GC
#if ENABLE_PARTIAL_GC
    if (recycler->inPartialCollectMode)
    {
        Assert(!recycler->DoQueueTrackedObject());
    }
    else
#endif
    {
        Assert(recycler->DoQueueTrackedObject());

        if (!recycler->QueueTrackedObject(object))
        {
            // Failed to add to track stack due to OOM.
            return false;
        }
    }

    RECYCLER_STATS_INC(recycler, trackCount);
    RECYCLER_STATS_INC_IF(this->ObjectInfo(objectIndex) & FinalizeBit, recycler, finalizeCount);

    // We have processed this object as tracked, we can clear the NewTrackBit
    this->ObjectInfo(objectIndex) &= ~NewTrackBit;

    return true;
#else
    // REVIEW: Is this correct? Or should we remove the track bit always?
    return false;
#endif
}